

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::ZoneAllocator::_releaseDynamic(ZoneAllocator *this,void *p,size_t size)

{
  byte bVar1;
  uint uVar2;
  Zone *pZVar3;
  DynamicBlock *pDVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint uVar7;
  DynamicBlock **ppDVar8;
  Zone *pZVar9;
  Slot *pSVar10;
  uint extraout_EDX;
  DynamicBlock **ppDVar11;
  uint8_t *extraout_RDX;
  ZoneAllocator *pZVar12;
  ZoneAllocator *pZVar13;
  uint uVar14;
  ulong uVar15;
  size_t sStack_40;
  
  if (this->_zone == (Zone *)0x0) {
    _releaseDynamic();
  }
  else {
    pZVar13 = *(ZoneAllocator **)((long)p + -8);
    ppDVar8 = &this->_dynamicBlocks;
    ppDVar11 = ppDVar8;
    do {
      pZVar12 = (ZoneAllocator *)*ppDVar11;
      if (pZVar12 == pZVar13) break;
      ppDVar11 = (DynamicBlock **)pZVar12->_slots;
    } while (pZVar12 != (ZoneAllocator *)0x0);
    this = pZVar13;
    if (pZVar12 != (ZoneAllocator *)0x0) {
      pZVar3 = pZVar13->_zone;
      pDVar4 = (DynamicBlock *)pZVar13->_slots[0];
      ppDVar11 = (DynamicBlock **)&pZVar3->_end;
      if (pZVar3 == (Zone *)0x0) {
        ppDVar11 = ppDVar8;
      }
      *ppDVar11 = pDVar4;
      if (pDVar4 != (DynamicBlock *)0x0) {
        pDVar4->prev = (DynamicBlock *)pZVar3;
      }
      free(pZVar13);
      return;
    }
  }
  _releaseDynamic();
  if (extraout_EDX < 0x81) {
    pZVar13 = this;
    if (((ZoneAllocator *)p)->_zone == (Zone *)0x0) goto LAB_00125278;
    uVar15 = (ulong)extraout_EDX;
    uVar7 = *(uint *)(ZoneHash_primeArray + uVar15 * 8);
    pZVar3 = this->_zone;
    pZVar9 = (Zone *)_allocZeroed((ZoneAllocator *)p,(ulong)uVar7 * 8,&sStack_40);
    if (pZVar9 == (Zone *)0x0) {
      return;
    }
    pZVar13 = (ZoneAllocator *)(ulong)*(uint *)(this->_slots + 1);
    this->_zone = pZVar9;
    *(uint *)(this->_slots + 1) = uVar7;
    *(int *)((long)this->_slots + 0xc) = (int)(long)((double)uVar7 * 0.9);
    uVar2 = *(uint *)(ZoneHash_primeArray + uVar15 * 8 + 4);
    *(uint *)(this->_slots + 2) = uVar2;
    bVar1 = ZoneHash_primeShift[uVar15];
    *(byte *)((long)this->_slots + 0x14) = bVar1;
    *(char *)((long)this->_slots + 0x15) = (char)extraout_EDX;
    if (pZVar13 != (ZoneAllocator *)0x0) {
      pZVar12 = (ZoneAllocator *)0x0;
      do {
        puVar6 = (&pZVar3->_ptr)[(long)pZVar12];
        while (puVar6 != (uint8_t *)0x0) {
          puVar5 = *(uint8_t **)puVar6;
          uVar14 = *(uint *)(puVar6 + 8) -
                   (int)((ulong)*(uint *)(puVar6 + 8) * (ulong)uVar2 >> (bVar1 & 0x3f)) * uVar7;
          *(uint8_t **)puVar6 = (&pZVar9->_ptr)[uVar14];
          (&pZVar9->_ptr)[uVar14] = puVar6;
          puVar6 = puVar5;
        }
        pZVar12 = (ZoneAllocator *)((long)&pZVar12->_zone + 1);
      } while (pZVar12 != pZVar13);
    }
    if (pZVar3 == (Zone *)(this->_slots + 3)) {
      return;
    }
    if (((ZoneAllocator *)p)->_zone == (Zone *)0x0) goto LAB_0012527d;
    if (pZVar3 != (Zone *)0x0) {
      if (pZVar13 != (ZoneAllocator *)0x0) {
        ZoneHashBase::_rehash();
        return;
      }
      goto LAB_00125287;
    }
  }
  else {
    ZoneHashBase::_rehash();
    pZVar13 = this;
LAB_00125278:
    ZoneHashBase::_rehash();
LAB_0012527d:
    ZoneHashBase::_rehash();
  }
  ZoneHashBase::_rehash();
LAB_00125287:
  ZoneHashBase::_rehash();
  uVar7 = *(uint *)(extraout_RDX + 8) -
          (int)((ulong)*(uint *)(pZVar13->_slots + 2) * (ulong)*(uint *)(extraout_RDX + 8) >>
               (*(byte *)((long)pZVar13->_slots + 0x14) & 0x3f)) * *(int *)(pZVar13->_slots + 1);
  pZVar3 = pZVar13->_zone;
  *(uint8_t **)extraout_RDX = (&pZVar3->_ptr)[uVar7];
  (&pZVar3->_ptr)[uVar7] = extraout_RDX;
  pSVar10 = (Slot *)((long)&pZVar13->_slots[0]->next + 1);
  pZVar13->_slots[0] = pSVar10;
  if ((Slot *)(ulong)*(uint *)((long)pZVar13->_slots + 0xc) < pSVar10) {
    bVar1 = *(byte *)((long)pZVar13->_slots + 0x15);
    uVar7 = 0x7e;
    if (bVar1 < 0x7e) {
      uVar7 = (uint)bVar1;
    }
    if ((uint)bVar1 < uVar7 + 2) {
      ZoneHashBase::_rehash((ZoneHashBase *)pZVar13,(ZoneAllocator *)p,uVar7 + 2);
    }
  }
  return;
}

Assistant:

void ZoneAllocator::_releaseDynamic(void* p, size_t size) noexcept {
  DebugUtils::unused(size);
  ASMJIT_ASSERT(isInitialized());

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneAllocator_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  ::free(block);
}